

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlTreeEnsureXMLDecl(xmlDocPtr doc)

{
  xmlNsPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = doc->oldNs;
  if (pxVar1 == (xmlNsPtr)0x0) {
    pxVar1 = (xmlNsPtr)(*xmlMalloc)(0x30);
    if (pxVar1 == (xmlNsPtr)0x0) {
      pxVar1 = (xmlNsPtr)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"allocating the XML namespace");
    }
    else {
      pxVar1->next = (_xmlNs *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->_private = (void *)0x0;
      pxVar1->context = (_xmlDoc *)0x0;
      pxVar1->href = (xmlChar *)0x0;
      pxVar1->prefix = (xmlChar *)0x0;
      pxVar1->type = XML_NAMESPACE_DECL;
      pxVar2 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
      pxVar1->href = pxVar2;
      pxVar2 = xmlStrdup("xml");
      pxVar1->prefix = pxVar2;
      doc->oldNs = pxVar1;
    }
  }
  return pxVar1;
}

Assistant:

static xmlNsPtr
xmlTreeEnsureXMLDecl(xmlDocPtr doc)
{
    if (doc == NULL)
	return (NULL);
    if (doc->oldNs != NULL)
	return (doc->oldNs);
    {
	xmlNsPtr ns;
	ns = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
	if (ns == NULL) {
	    xmlTreeErrMemory(
		"allocating the XML namespace");
	    return (NULL);
	}
	memset(ns, 0, sizeof(xmlNs));
	ns->type = XML_LOCAL_NAMESPACE;
	ns->href = xmlStrdup(XML_XML_NAMESPACE);
	ns->prefix = xmlStrdup((const xmlChar *)"xml");
	doc->oldNs = ns;
	return (ns);
    }
}